

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_lite.cc
# Opt level: O2

bool google::protobuf::internal::WireFormatLite::SkipField(CodedInputStream *input,uint32 tag)

{
  int iVar1;
  bool bVar2;
  int in_EAX;
  uint64 value;
  uint64 local_18;
  
  if (tag < 8) goto LAB_002597a8;
  bVar2 = false;
  switch(tag & 7) {
  case 0:
    bVar2 = io::CodedInputStream::ReadVarint64(input,&local_18);
    break;
  case 1:
    bVar2 = io::CodedInputStream::ReadLittleEndian64(input,&local_18);
    break;
  case 2:
    local_18._0_4_ = in_EAX;
    bVar2 = io::CodedInputStream::ReadVarint32(input,(uint32 *)&local_18);
    if (bVar2) {
      bVar2 = io::CodedInputStream::Skip(input,(int)local_18);
      return bVar2;
    }
    goto LAB_002597a8;
  case 3:
    iVar1 = input->recursion_budget_;
    input->recursion_budget_ = iVar1 + -1;
    if ((0 < iVar1) && (bVar2 = SkipMessage(input), bVar2)) {
      if (input->recursion_budget_ < input->recursion_limit_) {
        input->recursion_budget_ = input->recursion_budget_ + 1;
      }
      return input->last_tag_ == (tag & 0xfffffff8 | 4);
    }
LAB_002597a8:
    bVar2 = false;
    break;
  case 5:
    bVar2 = io::CodedInputStream::ReadLittleEndian32(input,(uint32 *)&local_18);
  }
  return bVar2;
}

Assistant:

bool WireFormatLite::SkipField(io::CodedInputStream* input, uint32 tag) {
  // Field number 0 is illegal.
  if (WireFormatLite::GetTagFieldNumber(tag) == 0) return false;
  switch (WireFormatLite::GetTagWireType(tag)) {
    case WireFormatLite::WIRETYPE_VARINT: {
      uint64 value;
      if (!input->ReadVarint64(&value)) return false;
      return true;
    }
    case WireFormatLite::WIRETYPE_FIXED64: {
      uint64 value;
      if (!input->ReadLittleEndian64(&value)) return false;
      return true;
    }
    case WireFormatLite::WIRETYPE_LENGTH_DELIMITED: {
      uint32 length;
      if (!input->ReadVarint32(&length)) return false;
      if (!input->Skip(length)) return false;
      return true;
    }
    case WireFormatLite::WIRETYPE_START_GROUP: {
      if (!input->IncrementRecursionDepth()) return false;
      if (!SkipMessage(input)) return false;
      input->DecrementRecursionDepth();
      // Check that the ending tag matched the starting tag.
      if (!input->LastTagWas(
              WireFormatLite::MakeTag(WireFormatLite::GetTagFieldNumber(tag),
                                      WireFormatLite::WIRETYPE_END_GROUP))) {
        return false;
      }
      return true;
    }
    case WireFormatLite::WIRETYPE_END_GROUP: {
      return false;
    }
    case WireFormatLite::WIRETYPE_FIXED32: {
      uint32 value;
      if (!input->ReadLittleEndian32(&value)) return false;
      return true;
    }
    default: {
      return false;
    }
  }
}